

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O0

bool Unit_Test::verifyImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *value,bool isAnyValue)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  uchar *puVar5;
  byte *pbVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  int in_ECX;
  uint uVar8;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_R9;
  byte in_stack_00000008;
  size_t id;
  const_iterator v;
  bool equal;
  uint8_t *endX;
  uint8_t *outputX;
  uint8_t *endY;
  uint8_t *outputY;
  uint32_t rowSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  imageException *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__n;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  byte local_61;
  byte *local_60;
  byte *local_58;
  byte *local_50;
  byte *local_48;
  uint32_t local_40;
  byte local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  int local_20;
  uint local_1c;
  int local_18;
  int local_14;
  ImageTemplate<unsigned_char> *local_10;
  
  local_29 = in_stack_00000008 & 1;
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RDI);
  if (((!bVar1) && (local_1c != 0)) && (local_20 != 0)) {
    in_stack_ffffffffffffff7c = local_14 + local_1c;
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(local_10);
    if (in_stack_ffffffffffffff7c <= uVar3) {
      in_stack_ffffffffffffff78 = local_18 + local_20;
      uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(local_10);
      if (in_stack_ffffffffffffff78 <= uVar3) {
        local_40 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_10);
        puVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_10);
        uVar8 = local_18 * local_40;
        bVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_10);
        local_48 = puVar5 + (ulong)(local_14 * (uint)bVar2) + (ulong)uVar8;
        local_50 = local_48 + local_40 * local_20;
        bVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_10);
        local_1c = local_1c * bVar2;
        do {
          if (local_48 == local_50) {
            return true;
          }
          local_58 = local_48;
          local_60 = local_48 + local_1c;
          if ((local_29 & 1) == 0) {
            __n = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
            for (; local_58 != local_60; local_58 = local_58 + 1) {
              in_stack_ffffffffffffff54 = (uint)*local_58;
              in_stack_ffffffffffffff48 =
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(__n->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
              pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (local_28,(size_type)__n);
              if (in_stack_ffffffffffffff54 != *pbVar6) {
                return false;
              }
              __n = in_stack_ffffffffffffff48;
              pvVar7 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_28);
              if (in_stack_ffffffffffffff48 == pvVar7) {
                __n = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
              }
            }
          }
          else {
            for (; local_58 != local_60; local_58 = local_58 + 1) {
              local_61 = 0;
              local_70._M_current =
                   (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                      (in_stack_ffffffffffffff48);
              while( true ) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (in_stack_ffffffffffffff48);
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_ffffffffffffff48);
                if (!bVar1) break;
                bVar2 = *local_58;
                pbVar6 = __gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator*(&local_70);
                if (bVar2 == *pbVar6) {
                  local_61 = 1;
                  break;
                }
                __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator++(&local_70);
              }
              if ((local_61 & 1) == 0) {
                return false;
              }
            }
          }
          local_48 = local_48 + local_40;
        } while( true );
      }
    }
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException
            (in_stack_ffffffffffffff80,
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

bool verifyImage( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                      const std::vector < uint8_t > & value, bool isAnyValue )
    {
        if( image.empty() || width == 0 || height == 0 || x + width > image.width() || y + height > image.height() )
            throw imageException( "Bad input parameters in image function" );

        const uint32_t rowSize  = image.rowSize();
        const uint8_t * outputY = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY    = outputY + rowSize * height;

        width = width * image.colorCount();

        for ( ; outputY != endY; outputY += rowSize ) {
            const uint8_t * outputX = outputY;
            const uint8_t * endX    = outputX + width;

            if( isAnyValue ) {
                for( ; outputX != endX; ++outputX ) {
                    bool equal = false;

                    for( std::vector < uint8_t >::const_iterator v = value.begin(); v != value.end(); ++v ) {
                        if( (*outputX) == (*v) ) {
                            equal = true;
                            break;
                        }
                    }

                    if( !equal )
                        return false;
                }
            }
            else {
                size_t id = 0;
                for( ; outputX != endX; ++outputX ) {
                    if( (*outputX) != value[id++] )
                        return false;

                    if( id == value.size() )
                        id = 0;
                }
            }
        }

        return true;
    }